

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.hpp
# Opt level: O2

string * __thiscall
duckdb::ErrorManager::FormatExceptionRecursive<std::__cxx11::string>
          (string *__return_storage_ptr__,ErrorManager *this,ErrorType error_type,
          vector<duckdb::ExceptionFormatValue,_true> *values,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param)

{
  string *value;
  undefined1 local_80 [56];
  string local_48 [32];
  
  ::std::__cxx11::string::string((string *)local_80,(string *)param);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_80 + 0x20),(ExceptionFormatValue *)local_80,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            (&values->
              super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ,(ExceptionFormatValue *)(local_80 + 0x20));
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string((string *)local_80);
  FormatExceptionRecursive_abi_cxx11_(__return_storage_ptr__,this,error_type,values);
  return __return_storage_ptr__;
}

Assistant:

string FormatExceptionRecursive(ErrorType error_type, vector<ExceptionFormatValue> &values, T param,
	                                ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return FormatExceptionRecursive(error_type, values, params...);
	}